

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O2

bool __thiscall
Diligent::DearchiverBase::UnpackPSOSignatures<Diligent::RayTracingPipelineStateCreateInfo>
          (DearchiverBase *this,PSOData<Diligent::RayTracingPipelineStateCreateInfo> *PSO,
          IRenderDevice *pRenderDevice)

{
  IPipelineResourceSignature **ppIVar1;
  ulong uVar2;
  ulong count;
  RefCntAutoPtr<Diligent::IPipelineResourceSignature> pSignature;
  string msg;
  RefCntAutoPtr<Diligent::IPipelineResourceSignature> local_68;
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
  *local_60;
  IRenderDevice *local_58;
  string local_50;
  
  count = (ulong)(PSO->CreateInfo).super_PipelineStateCreateInfo.ResourceSignaturesCount;
  local_58 = pRenderDevice;
  if (count == 0) {
    FormatString<char[91]>
              (&local_50,
               (char (*) [91])
               "PSO must have at least one resource signature (including PSOs that use implicit signature)"
              );
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"UnpackPSOSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp"
               ,0x113);
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    ppIVar1 = DynamicLinearAllocator::Allocate<Diligent::IPipelineResourceSignature*>
                        (&PSO->Allocator,count);
    (PSO->CreateInfo).super_PipelineStateCreateInfo.ppResourceSignatures = ppIVar1;
    local_60 = (vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
                *)&PSO->Objects;
    for (uVar2 = 0; count != uVar2; uVar2 = uVar2 + 1) {
      local_50._M_dataplus._M_p = (pointer)local_58;
      local_50._M_string_length = (size_type)(PSO->PRSNames)._M_elems[uVar2];
      local_50.field_2._M_allocated_capacity._0_4_ =
           (PSO->CreateInfo).super_PipelineStateCreateInfo.PSODesc.SRBAllocationGranularity;
      (*(this->super_ObjectBase<Diligent::IDearchiver>).
        super_RefCountedObject<Diligent::IDearchiver>.super_IDearchiver.super_IObject._vptr_IObject
        [0xe])(&local_68,this,&local_50,
               (ulong)((PSO->InternalCI).Flags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0));
      if (local_68.m_pObject == (IPipelineResourceSignature *)0x0) {
        RefCntAutoPtr<Diligent::IPipelineResourceSignature>::Release(&local_68);
        return false;
      }
      ppIVar1[uVar2] = local_68.m_pObject;
      std::
      vector<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceObject>>>
      ::emplace_back<Diligent::RefCntAutoPtr<Diligent::IPipelineResourceSignature>>
                (local_60,&local_68);
      RefCntAutoPtr<Diligent::IPipelineResourceSignature>::Release(&local_68);
    }
  }
  return true;
}

Assistant:

bool DearchiverBase::UnpackPSOSignatures(PSOData<CreateInfoType>& PSO, IRenderDevice* pRenderDevice)
{
    const Uint32 ResourceSignaturesCount = PSO.CreateInfo.ResourceSignaturesCount;
    if (ResourceSignaturesCount == 0)
    {
        UNEXPECTED("PSO must have at least one resource signature (including PSOs that use implicit signature)");
        return true;
    }
    IPipelineResourceSignature** const ppResourceSignatures = PSO.Allocator.template Allocate<IPipelineResourceSignature*>(ResourceSignaturesCount);

    PSO.CreateInfo.ppResourceSignatures = ppResourceSignatures;
    for (Uint32 i = 0; i < ResourceSignaturesCount; ++i)
    {
        ResourceSignatureUnpackInfo UnpackInfo{pRenderDevice, PSO.PRSNames[i]};
        UnpackInfo.SRBAllocationGranularity = PSO.CreateInfo.PSODesc.SRBAllocationGranularity;

        auto pSignature = UnpackResourceSignature(UnpackInfo, (PSO.InternalCI.Flags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0);
        if (!pSignature)
            return false;

        ppResourceSignatures[i] = pSignature;
        PSO.Objects.emplace_back(std::move(pSignature));
    }
    return true;
}